

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O3

int mbedtls_x509_set_extension
              (mbedtls_asn1_named_data **head,char *oid,size_t oid_len,int critical,uchar *val,
              size_t val_len)

{
  mbedtls_asn1_named_data *pmVar1;
  int iVar2;
  
  iVar2 = 0;
  pmVar1 = mbedtls_asn1_store_named_data(head,oid,oid_len,(uchar *)0x0,val_len + 1);
  if (pmVar1 == (mbedtls_asn1_named_data *)0x0) {
    iVar2 = -0x2880;
  }
  else {
    *(pmVar1->val).p = (uchar)critical;
    memcpy((pmVar1->val).p + 1,val,val_len);
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_set_extension( mbedtls_asn1_named_data **head, const char *oid, size_t oid_len,
                        int critical, const unsigned char *val, size_t val_len )
{
    mbedtls_asn1_named_data *cur;

    if( ( cur = mbedtls_asn1_store_named_data( head, oid, oid_len,
                                       NULL, val_len + 1 ) ) == NULL )
    {
        return( MBEDTLS_ERR_X509_ALLOC_FAILED );
    }

    cur->val.p[0] = critical;
    memcpy( cur->val.p + 1, val, val_len );

    return( 0 );
}